

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

QModelIndex * __thiscall
QtPrivate::QCalendarView::moveCursor
          (QModelIndex *__return_storage_ptr__,QCalendarView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  undefined8 uVar1;
  undefined4 uVar2;
  long lVar3;
  QCalendarModel *this_00;
  undefined8 uVar4;
  long in_FS_OFFSET;
  qint64 local_80;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  YearMonthDay local_60;
  undefined1 local_51;
  qint64 local_50;
  void *local_48;
  qint64 *local_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model((QAbstractItemView *)this);
  lVar3 = QMetaObject::cast((QObject *)&QCalendarModel::staticMetaObject);
  if (lVar3 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QTableView::moveCursor(__return_storage_ptr__,&this->super_QTableView,cursorAction,modifiers);
      return __return_storage_ptr__;
    }
    goto LAB_003c8f25;
  }
  uVar1 = *(undefined8 *)(lVar3 + 0x18);
  local_60._0_8_ = uVar1;
  if (this->readOnly == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QAbstractItemView::currentIndex(__return_storage_ptr__,(QAbstractItemView *)this);
      return __return_storage_ptr__;
    }
    goto LAB_003c8f25;
  }
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_78,(QAbstractItemView *)this);
  this_00 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
  local_80 = (qint64)QCalendarModel::dateForCell(this_00,(int)local_78,local_78._4_4_);
  switch(cursorAction) {
  case MoveUp:
    goto LAB_003c8e53;
  case MoveDown:
    goto LAB_003c8e53;
  case MoveLeft:
    QWidget::layoutDirection((QWidget *)this);
    goto LAB_003c8e53;
  case MoveRight:
    QWidget::layoutDirection((QWidget *)this);
LAB_003c8e53:
    local_80 = QDate::addDays((longlong)&local_80);
    break;
  case MoveHome:
    local_48 = (void *)QCalendar::partsFromDate((QDate)&local_60);
    if ((int)((ulong)local_48 >> 0x20) != -0x80000000) {
      local_40 = (qint64 *)CONCAT44(local_40._4_4_,1);
LAB_003c8e98:
      local_80 = QCalendar::dateFromParts(&local_60);
    }
    break;
  case MoveEnd:
    local_48 = (void *)QCalendar::partsFromDate((QDate)&local_60);
    if ((ulong)local_48 >> 0x20 != 0x80000000) {
      uVar2 = QCalendar::daysInMonth((int)&local_60,(int)((ulong)local_48 >> 0x20));
      local_40 = (qint64 *)CONCAT44(local_40._4_4_,uVar2);
      goto LAB_003c8e98;
    }
    break;
  case MovePageUp:
    uVar4 = 0xffffffff;
    goto LAB_003c8eb1;
  case MovePageDown:
    uVar4 = 1;
LAB_003c8eb1:
    local_80 = QDate::addMonths(&local_80,uVar4,uVar1);
    break;
  case MoveNext:
  case MovePrevious:
    goto switchD_003c8d9c_caseD_8;
  }
  local_40 = &local_50;
  local_50 = local_80;
  local_38 = &local_51;
  local_51 = 1;
  local_48 = (void *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
switchD_003c8d9c_caseD_8:
  QAbstractItemView::currentIndex(__return_storage_ptr__,(QAbstractItemView *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_003c8f25:
  __stack_chk_fail();
}

Assistant:

QModelIndex QCalendarView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel)
        return QTableView::moveCursor(cursorAction, modifiers);

    QCalendar cal = calendarModel->calendar();

    if (readOnly)
        return currentIndex();

    QModelIndex index = currentIndex();
    QDate currentDate = static_cast<QCalendarModel*>(model())->dateForCell(index.row(), index.column());
    switch (cursorAction) {
        case QAbstractItemView::MoveUp:
            currentDate = currentDate.addDays(-7);
            break;
        case QAbstractItemView::MoveDown:
            currentDate = currentDate.addDays(7);
            break;
        case QAbstractItemView::MoveLeft:
            currentDate = currentDate.addDays(isRightToLeft() ? 1 : -1);
            break;
        case QAbstractItemView::MoveRight:
            currentDate = currentDate.addDays(isRightToLeft() ? -1 : 1);
            break;
        case QAbstractItemView::MoveHome: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = 1;
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MoveEnd: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = cal.daysInMonth(parts.month, parts.year);
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MovePageUp:
            currentDate = currentDate.addMonths(-1, cal);
            break;
        case QAbstractItemView::MovePageDown:
            currentDate = currentDate.addMonths(1, cal);
            break;
        case QAbstractItemView::MoveNext:
        case QAbstractItemView::MovePrevious:
            return currentIndex();
        default:
            break;
    }
    emit changeDate(currentDate, true);
    return currentIndex();
}